

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O1

QList<QAsn1Element> * __thiscall
QAsn1Element::toList(QList<QAsn1Element> *__return_storage_ptr__,QAsn1Element *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  long in_FS_OFFSET;
  QAsn1Element local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QAsn1Element *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (this->mType == '0') {
    local_68.mType = '\0';
    local_68._1_7_ = 0xaaaaaaaaaaaaaa;
    local_68.mValue.d.d = (Data *)0x0;
    local_68.mValue.d.ptr = (char *)0x0;
    local_68.mValue.d.size = 0;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::QDataStream((QDataStream *)&local_48,&this->mValue);
    sVar1 = read(&local_68,(int)(QDataStream *)&local_48,__buf,in_RCX);
    if ((char)sVar1 != '\0') {
      do {
        QtPrivate::QMovableArrayOps<QAsn1Element>::emplace<QAsn1Element_const&>
                  ((QMovableArrayOps<QAsn1Element> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_68);
        QList<QAsn1Element>::end(__return_storage_ptr__);
        sVar1 = read(&local_68,(int)&local_48,__buf_00,in_RCX);
      } while ((char)sVar1 != '\0');
    }
    QDataStream::~QDataStream((QDataStream *)&local_48);
    if (&(local_68.mValue.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_68.mValue.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QAsn1Element> QAsn1Element::toList() const
{
    QList<QAsn1Element> items;
    if (mType == SequenceType) {
        QAsn1Element elem;
        QDataStream stream(mValue);
        while (elem.read(stream))
            items << elem;
    }
    return items;
}